

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

void I_NetCmd(void)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  char *pcVar8;
  in_addr *piVar9;
  uint uVar10;
  ulong uVar11;
  FString FStack_50;
  undefined1 auStack_48 [16];
  undefined8 uStack_38;
  socklen_t sStack_2c;
  
  if (doomcom.command != 2) {
    if (doomcom.command == 1) {
      PacketSend();
      return;
    }
    I_Error("Bad net cmd: %i\n",(ulong)(uint)(int)doomcom.command);
    return;
  }
  sStack_2c = 0x10;
  uVar11 = 0;
  uVar4 = recvfrom(mysocket,TransmitBuffer,8000,0,(sockaddr *)auStack_48,&sStack_2c);
  uVar2 = (uint)doomcom.numnodes;
  if (0 < doomcom.numnodes) {
    piVar9 = &sendaddress[0].sin_addr;
    uVar11 = 0;
    do {
      if ((auStack_48._4_4_ == piVar9->s_addr) &&
         (auStack_48._2_2_ == ((sockaddr_in *)(piVar9 + -1))->sin_port)) goto LAB_004bdd47;
      uVar11 = uVar11 + 1;
      piVar9 = piVar9 + 4;
    } while (uVar2 != uVar11);
    uVar11 = (ulong)uVar2;
  }
LAB_004bdd47:
  uVar10 = 0xffffffff;
  if ((uint)uVar11 != uVar2) {
    uVar10 = (uint)uVar11;
  }
  iVar3 = (int)uVar4;
  if (iVar3 == -1 && -1 < (int)uVar10) {
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    if (iVar3 == 0xb) {
      doomcom.remotenode = -1;
      uVar4 = 0xffffffff;
      bVar1 = false;
    }
    else {
      if (iVar3 == 0x68) {
        puVar6 = (undefined8 *)
                 ((ulong)(((&DAT_00a392d8)[(ulong)sendplayer[uVar10] * 0xa8] - 1 & 0x1cf) * 0x18) +
                 (&DAT_00a392c8)[(ulong)sendplayer[uVar10] * 0x54]);
        if (StartScreen == (FStartupScreen *)0x0) {
          do {
            puVar7 = puVar6;
            puVar6 = (undefined8 *)*puVar7;
          } while (*(int *)(puVar7 + 1) != 0x1cf);
          Printf("The connection from %s was dropped.\n",*(undefined8 *)(puVar7[2] + 0x28));
        }
        else {
          do {
            puVar7 = puVar6;
            puVar6 = (undefined8 *)*puVar7;
          } while (*(int *)(puVar7 + 1) != 0x1cf);
          (*StartScreen->_vptr_FStartupScreen[7])
                    (StartScreen,"The connection from %s was dropped.\n",
                     *(undefined8 *)(puVar7[2] + 0x28));
        }
        doomcom.data[0] = 0x80;
        uVar4 = 1;
      }
      else {
        pcVar8 = strerror(iVar3);
        I_Error("GetPacket: %s",pcVar8);
        uVar4 = 0xffffffff;
      }
      bVar1 = true;
    }
    if (!bVar1) {
      return;
    }
  }
  else if (iVar3 < 1 || (int)uVar10 < 0) {
    if (0 < iVar3) {
      if (((iVar3 != 2) || (TransmitBuffer[0] != '0')) || (TransmitBuffer[1] != '\x02')) {
        pcVar8 = inet_ntoa((in_addr)auStack_48._4_4_);
        DPrintf(2,"Dropped packet: Unknown host (%s:%d)\n",pcVar8,(ulong)(ushort)auStack_48._2_2_);
      }
      doomcom.remotenode = -1;
      return;
    }
  }
  else {
    doomcom.data[0] = TransmitBuffer[0] & 0xfb;
    if ((TransmitBuffer[0] & 4) == 0) {
      memcpy(doomcom.data + 1,TransmitBuffer + 1,(ulong)(iVar3 - 1));
    }
    else {
      uStack_38 = 13999;
      iVar3 = uncompress(0xa2adb5,&uStack_38,TransmitBuffer + 1,iVar3 + -1);
      if (iVar3 != 0) {
        M_ZLibError((int)&FStack_50);
        Printf("Net decompression failed (zlib error %s)\n",FStack_50.Chars);
        FString::~FString(&FStack_50);
        doomcom.remotenode = -1;
        return;
      }
      uVar4 = (ulong)((int)uStack_38 + 1);
    }
  }
  doomcom.datalength = (SWORD)uVar4;
  doomcom.remotenode = (SWORD)uVar10;
  return;
}

Assistant:

void I_NetCmd (void)
{
	if (doomcom.command == CMD_SEND)
	{
		PacketSend ();
	}
	else if (doomcom.command == CMD_GET)
	{
		PacketGet ();
	}
	else
		I_Error ("Bad net cmd: %i\n",doomcom.command);
}